

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

int tcd_encode_tile(opj_tcd_t *tcd,int tileno,uchar *dest,int len,opj_codestream_info_t *cstr_info)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  opj_cp_t *cp;
  opj_tccp_t *poVar3;
  opj_image_t *image;
  opj_tcd_tile_t *tile;
  opj_tcd_resolution_t *poVar4;
  opj_tile_info_t *poVar5;
  opj_image_comp_t *poVar6;
  opj_tcd_tilecomp_t *poVar7;
  OPJ_INT32 *pOVar8;
  int *piVar9;
  int iVar10;
  opj_packet_info_t *poVar11;
  opj_t1_t *t1;
  opj_t2_t *t2;
  int iVar12;
  opj_tcp_t *poVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  opj_tcd_tilecomp_t *poVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  double dVar23;
  
  cp = tcd->cp;
  poVar13 = cp->tcps;
  poVar3 = poVar13->tccps;
  image = tcd->image;
  tcd->tcd_tileno = tileno;
  tile = tcd->tcd_image->tiles;
  tcd->tcd_tile = tile;
  poVar13 = poVar13 + tileno;
  tcd->tcp = poVar13;
  if (tcd->cur_tp_num == 0) {
    dVar23 = opj_clock();
    tcd->encoding_time = dVar23;
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      poVar19 = tile->comps;
      lVar18 = 4;
      iVar14 = 0;
      for (lVar17 = 0; lVar17 < poVar19->numresolutions; lVar17 = lVar17 + 1) {
        poVar4 = poVar19->resolutions;
        poVar5 = cstr_info->tile;
        poVar5[tileno].pw[lVar17] = *(int *)((long)poVar4->bands + lVar18 * 4 + -0x20);
        iVar21 = *(int *)((long)poVar4->bands + lVar18 * 4 + -0x1c);
        poVar5[tileno].ph[lVar17] = iVar21;
        iVar14 = iVar14 + iVar21 * *(int *)((long)poVar4->bands + lVar18 * 4 + -0x20);
        poVar5[tileno].pdx[lVar17] = poVar3->prcw[lVar17];
        poVar5[tileno].pdy[lVar17] = poVar3->prch[lVar17];
        lVar18 = lVar18 + 0x26;
      }
      poVar11 = (opj_packet_info_t *)
                calloc((long)(iVar14 * cstr_info->numcomps * cstr_info->numlayers),0x20);
      cstr_info->tile[tileno].packet = poVar11;
    }
    for (lVar18 = 0; lVar18 < tile->numcomps; lVar18 = lVar18 + 1) {
      poVar6 = image->comps;
      iVar14 = 0;
      if (poVar6[lVar18].sgnd == 0) {
        iVar14 = 1 << ((char)poVar6[lVar18].prec - 1U & 0x1f);
      }
      OVar1 = poVar6[lVar18].dx;
      iVar12 = (int)(image->x0 + OVar1 + -1) / (int)OVar1;
      iVar16 = (int)(image->y0 + poVar6[lVar18].dy + -1) / (int)poVar6[lVar18].dy;
      poVar7 = tile->comps;
      poVar19 = poVar7 + lVar18;
      iVar21 = poVar7[lVar18].x1;
      iVar20 = iVar21 - poVar7[lVar18].x0;
      iVar10 = (int)(~image->x0 + OVar1 + image->x1) / (int)OVar1;
      OVar1 = poVar13->tccps[lVar18].qmfbid;
      if (OVar1 == 0) {
        iVar15 = poVar19->y0;
        iVar12 = (iVar15 - iVar16) * iVar10 - iVar12;
        for (; iVar15 < poVar19->y1; iVar15 = iVar15 + 1) {
          iVar16 = poVar19->x0;
          pOVar8 = poVar6[lVar18].data;
          iVar2 = poVar19->y0;
          piVar9 = poVar19->data;
          for (lVar17 = 0; iVar16 + (int)lVar17 < iVar21; lVar17 = lVar17 + 1) {
            piVar9[(iVar15 - iVar2) * iVar20 + lVar17] =
                 (pOVar8[(iVar16 + iVar12) + lVar17] - iVar14) * 0x800;
            iVar21 = poVar19->x1;
          }
          iVar12 = iVar12 + iVar10;
        }
      }
      else if (OVar1 == 1) {
        iVar15 = poVar19->y0;
        iVar12 = (iVar15 - iVar16) * iVar10 - iVar12;
        for (; iVar15 < poVar19->y1; iVar15 = iVar15 + 1) {
          iVar16 = poVar19->x0;
          pOVar8 = poVar6[lVar18].data;
          iVar2 = poVar19->y0;
          piVar9 = poVar19->data;
          for (lVar17 = 0; iVar16 + (int)lVar17 < iVar21; lVar17 = lVar17 + 1) {
            piVar9[(iVar15 - iVar2) * iVar20 + lVar17] = pOVar8[(iVar16 + iVar12) + lVar17] - iVar14
            ;
            iVar21 = poVar19->x1;
          }
          iVar12 = iVar12 + iVar10;
        }
      }
    }
    if (poVar13->mct != 0) {
      poVar19 = tile->comps;
      iVar14 = (poVar19->y1 - poVar19->y0) * (poVar19->x1 - poVar19->x0);
      if (poVar13->tccps->qmfbid == 0) {
        mct_encode_real(poVar19->data,poVar19[1].data,poVar19[2].data,iVar14);
      }
      else {
        mct_encode(poVar19->data,poVar19[1].data,poVar19[2].data,iVar14);
      }
    }
    lVar18 = 0x14;
    lVar22 = 0;
    for (lVar17 = 0; lVar17 < tile->numcomps; lVar17 = lVar17 + 1) {
      poVar19 = (opj_tcd_tilecomp_t *)((long)&tile->comps->x0 + lVar22);
      iVar14 = *(int *)((long)poVar13->tccps->stepsizes + lVar18 + -0x1c);
      if (iVar14 == 0) {
        dwt_encode_real(poVar19);
      }
      else if (iVar14 == 1) {
        dwt_encode(poVar19);
      }
      lVar22 = lVar22 + 0x30;
      lVar18 = lVar18 + 0x438;
    }
    t1 = t1_create(tcd->cinfo);
    t1_encode_cblks(t1,tile,poVar13);
    t1_destroy(t1);
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      cstr_info->index_write = 0;
    }
    if ((cp->disto_alloc == 0) && (cp->fixed_quality == 0)) {
      tcd_rateallocate_fixed(tcd);
    }
    else {
      tcd_rateallocate(tcd,dest,len,cstr_info);
    }
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    cstr_info->index_write = 1;
  }
  t2 = t2_create(tcd->cinfo,image,cp);
  iVar14 = t2_encode_packets(t2,tileno,tile,poVar13->numlayers,dest,len,cstr_info,tcd->tp_num,
                             tcd->tp_pos,tcd->cur_pino,FINAL_PASS,tcd->cur_totnum_tp);
  t2_destroy(t2);
  if (tcd->cur_tp_num == tcd->cur_totnum_tp + -1) {
    dVar23 = opj_clock();
    tcd->encoding_time = dVar23 - tcd->encoding_time;
    opj_event_msg(tcd->cinfo,4,"- tile encoded in %f s\n");
    lVar18 = 0x20;
    for (lVar17 = 0; lVar17 < tile->numcomps; lVar17 = lVar17 + 1) {
      free(*(void **)((long)&tile->comps->x0 + lVar18));
      lVar18 = lVar18 + 0x30;
    }
  }
  return iVar14;
}

Assistant:

int tcd_encode_tile(opj_tcd_t *tcd, int tileno, unsigned char *dest, int len, opj_codestream_info_t *cstr_info) {
	int compno;
	int l, i, numpacks = 0;
	opj_tcd_tile_t *tile = NULL;
	opj_tcp_t *tcd_tcp = NULL;
	opj_cp_t *cp = NULL;

	opj_tcp_t *tcp = &tcd->cp->tcps[0];
	opj_tccp_t *tccp = &tcp->tccps[0];
	opj_image_t *image = tcd->image;
	
	opj_t1_t *t1 = NULL;		/* T1 component */
	opj_t2_t *t2 = NULL;		/* T2 component */

	tcd->tcd_tileno = tileno;
	tcd->tcd_tile = tcd->tcd_image->tiles;
	tcd->tcp = &tcd->cp->tcps[tileno];

	tile = tcd->tcd_tile;
	tcd_tcp = tcd->tcp;
	cp = tcd->cp;

	if(tcd->cur_tp_num == 0){
		tcd->encoding_time = opj_clock();	/* time needed to encode a tile */
		/* INDEX >> "Precinct_nb_X et Precinct_nb_Y" */
		if(cstr_info) {
			opj_tcd_tilecomp_t *tilec_idx = &tile->comps[0];	/* based on component 0 */
			for (i = 0; i < tilec_idx->numresolutions; i++) {
				opj_tcd_resolution_t *res_idx = &tilec_idx->resolutions[i];
				
				cstr_info->tile[tileno].pw[i] = res_idx->pw;
				cstr_info->tile[tileno].ph[i] = res_idx->ph;
				
				numpacks += res_idx->pw * res_idx->ph;
				
				cstr_info->tile[tileno].pdx[i] = tccp->prcw[i];
				cstr_info->tile[tileno].pdy[i] = tccp->prch[i];
			}
			cstr_info->tile[tileno].packet = (opj_packet_info_t*) opj_calloc(cstr_info->numcomps * cstr_info->numlayers * numpacks, sizeof(opj_packet_info_t));
		}
		/* << INDEX */
		
		/*---------------TILE-------------------*/
		
		for (compno = 0; compno < tile->numcomps; compno++) {
			int x, y;
			
			int adjust = image->comps[compno].sgnd ? 0 : 1 << (image->comps[compno].prec - 1);
			int offset_x = int_ceildiv(image->x0, image->comps[compno].dx);
			int offset_y = int_ceildiv(image->y0, image->comps[compno].dy);
			
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			int tw = tilec->x1 - tilec->x0;
			int w = int_ceildiv(image->x1 - image->x0, image->comps[compno].dx);
			
			/* extract tile data */
			
			if (tcd_tcp->tccps[compno].qmfbid == 1) {
				for (y = tilec->y0; y < tilec->y1; y++) {
					/* start of the src tile scanline */
					int *data = &image->comps[compno].data[(tilec->x0 - offset_x) + (y - offset_y) * w];
					/* start of the dst tile scanline */
					int *tile_data = &tilec->data[(y - tilec->y0) * tw];
					for (x = tilec->x0; x < tilec->x1; x++) {
						*tile_data++ = *data++ - adjust;
					}
				}
			} else if (tcd_tcp->tccps[compno].qmfbid == 0) {
				for (y = tilec->y0; y < tilec->y1; y++) {
					/* start of the src tile scanline */
					int *data = &image->comps[compno].data[(tilec->x0 - offset_x) + (y - offset_y) * w];
					/* start of the dst tile scanline */
					int *tile_data = &tilec->data[(y - tilec->y0) * tw];
					for (x = tilec->x0; x < tilec->x1; x++) {
						*tile_data++ = (*data++ - adjust) << 11;
					}
					
				}
			}
		}
		
		/*----------------MCT-------------------*/
		if (tcd_tcp->mct) {
			int samples = (tile->comps[0].x1 - tile->comps[0].x0) * (tile->comps[0].y1 - tile->comps[0].y0);
			if (tcd_tcp->tccps[0].qmfbid == 0) {
				mct_encode_real(tile->comps[0].data, tile->comps[1].data, tile->comps[2].data, samples);
			} else {
				mct_encode(tile->comps[0].data, tile->comps[1].data, tile->comps[2].data, samples);
			}
		}
		
		/*----------------DWT---------------------*/
		
		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			if (tcd_tcp->tccps[compno].qmfbid == 1) {
				dwt_encode(tilec);
			} else if (tcd_tcp->tccps[compno].qmfbid == 0) {
				dwt_encode_real(tilec);
			}
		}
		
		/*------------------TIER1-----------------*/
		t1 = t1_create(tcd->cinfo);
		t1_encode_cblks(t1, tile, tcd_tcp);
		t1_destroy(t1);
		
		/*-----------RATE-ALLOCATE------------------*/
		
		/* INDEX */
		if(cstr_info) {
			cstr_info->index_write = 0;
		}
		if (cp->disto_alloc || cp->fixed_quality) {	/* fixed_quality */
			/* Normal Rate/distortion allocation */
			tcd_rateallocate(tcd, dest, len, cstr_info);
		} else {
			/* Fixed layer allocation */
			tcd_rateallocate_fixed(tcd);
		}
	}
	/*--------------TIER2------------------*/

	/* INDEX */
	if(cstr_info) {
		cstr_info->index_write = 1;
	}

	t2 = t2_create(tcd->cinfo, image, cp);
	l = t2_encode_packets(t2,tileno, tile, tcd_tcp->numlayers, dest, len, cstr_info,tcd->tp_num,tcd->tp_pos,tcd->cur_pino,FINAL_PASS,tcd->cur_totnum_tp);
	t2_destroy(t2);
	
	/*---------------CLEAN-------------------*/

	
	if(tcd->cur_tp_num == tcd->cur_totnum_tp - 1){
		tcd->encoding_time = opj_clock() - tcd->encoding_time;
		opj_event_msg(tcd->cinfo, EVT_INFO, "- tile encoded in %f s\n", tcd->encoding_time);

		/* cleaning memory */
		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			opj_aligned_free(tilec->data);
		}
	}

	return l;
}